

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall CClient::RegisterInterfaces(CClient *this)

{
  IInterface *in_RDI;
  IBlacklist *in_stack_ffffffffffffffe8;
  
  IInterface::Kernel(in_RDI);
  IKernel::RegisterInterface<IDemoRecorder>
            ((IKernel *)in_RDI,(IDemoRecorder *)in_stack_ffffffffffffffe8);
  IInterface::Kernel(in_RDI);
  IKernel::RegisterInterface<IDemoPlayer>
            ((IKernel *)in_RDI,(IDemoPlayer *)in_stack_ffffffffffffffe8);
  IInterface::Kernel(in_RDI);
  IKernel::RegisterInterface<IServerBrowser>
            ((IKernel *)in_RDI,(IServerBrowser *)in_stack_ffffffffffffffe8);
  IInterface::Kernel(in_RDI);
  IKernel::RegisterInterface<IFriends>((IKernel *)in_RDI,(IFriends *)in_stack_ffffffffffffffe8);
  IInterface::Kernel(in_RDI);
  IKernel::RegisterInterface<IBlacklist>((IKernel *)in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void CClient::RegisterInterfaces()
{
	Kernel()->RegisterInterface(static_cast<IDemoRecorder*>(&m_DemoRecorder));
	Kernel()->RegisterInterface(static_cast<IDemoPlayer*>(&m_DemoPlayer));
	Kernel()->RegisterInterface(static_cast<IServerBrowser*>(&m_ServerBrowser));
	Kernel()->RegisterInterface(static_cast<IFriends*>(&m_Friends));
	Kernel()->RegisterInterface(static_cast<IBlacklist*>(&m_Blacklist));
}